

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O3

bool __thiscall
tfeedback_decl::store
          (tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog,
          gl_transform_feedback_info *info,uint buffer,uint buffer_index,uint max_outputs,
          uint **used_components,bool *explicit_stride,bool has_xfb_qualifiers,void *mem_ctx)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  int iVar3;
  tfeedback_candidate *ptVar4;
  gl_transform_feedback_output *pgVar5;
  gl_transform_feedback_varying_info *pgVar6;
  uint32_t uVar7;
  bool bVar8;
  uint uVar9;
  uint *puVar10;
  char *pcVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  
  uVar14 = this->skip_components;
  if (uVar14 == 0) {
    if (this->next_buffer_separator == true) {
      uVar14 = 0;
    }
    else {
      if (has_xfb_qualifiers) {
        uVar20 = this->offset >> 2;
      }
      else {
        uVar20 = info->Buffers[buffer].Stride;
      }
      uVar14 = this->size;
      info->Varyings[info->NumVarying].Offset = uVar20 * 4;
      uVar19 = this->location;
      uVar13 = this->location_frac;
      uVar9 = num_components(this);
      if ((prog->TransformFeedback).BufferMode == 0x8c8c || has_xfb_qualifiers) {
        uVar12 = (ctx->Const).MaxTransformFeedbackInterleavedComponents;
        if (uVar12 < uVar9 + uVar20) {
          linker_error(prog,
                       "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS limit has been exceeded.")
          ;
          return false;
        }
      }
      else {
        uVar12 = (ctx->Const).MaxTransformFeedbackInterleavedComponents;
      }
      uVar15 = (uVar9 + uVar20) - 1;
      if (uVar12 <= uVar15) {
        __assert_fail("last_component < max_components",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                      ,0x4dc,
                      "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                     );
      }
      uVar17 = (ulong)(uVar20 >> 5);
      uVar15 = uVar15 >> 5;
      puVar10 = used_components[buffer];
      if (puVar10 == (uint *)0x0) {
        puVar10 = (uint *)rzalloc_array_size(mem_ctx,4,(uint)((ulong)uVar12 + 0x1f >> 5));
        used_components[buffer] = puVar10;
      }
      if (uVar20 >> 5 <= uVar15) {
        lVar16 = uVar15 - uVar17;
        lVar18 = 0;
        do {
          uVar12 = 0;
          if (lVar16 == lVar18) {
            uVar12 = uVar9 + uVar20 & 0x1f;
          }
          uVar12 = (-(uint)(lVar18 != 0) | -1 << ((byte)uVar20 & 0x1f)) &
                   (-(uint)(uVar12 == 0) | ~(-1 << (sbyte)uVar12));
          if ((uVar12 & puVar10[uVar17 + lVar18]) != 0) {
            linker_error(prog,"variable \'%s\', xfb_offset (%d) is causing aliasing.",
                         this->orig_name,(ulong)(uVar20 * 4));
            return false;
          }
          puVar10[uVar17 + lVar18] = puVar10[uVar17 + lVar18] | uVar12;
          lVar18 = lVar18 + 1;
        } while (lVar16 + 1 != lVar18);
      }
      if (uVar9 != 0) {
        bVar8 = this->next_buffer_separator;
        ptVar4 = this->matched_candidate;
        uVar2 = this->stream_id;
        uVar12 = info->NumOutputs;
        do {
          uVar7 = 4 - uVar13;
          if (uVar9 < 4 - uVar13) {
            uVar7 = uVar9;
          }
          if (max_outputs <= uVar12 && (uVar12 != 0 || max_outputs != 0)) {
            __assert_fail("(info->NumOutputs == 0 && max_outputs == 0) || info->NumOutputs < max_outputs"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                          ,0x4fa,
                          "bool tfeedback_decl::store(struct gl_context *, struct gl_shader_program *, struct gl_transform_feedback_info *, unsigned int, unsigned int, const unsigned int, unsigned int **, bool *, bool, const void *) const"
                         );
          }
          if ((((bVar8 & 1U) == 0) && (this->skip_components == 0)) &&
             (((ptVar4->toplevel_var->data).field_0x1 & 1) != 0)) {
            pgVar5 = info->Outputs;
            pgVar5[uVar12].ComponentOffset = uVar13;
            pgVar5[uVar12].OutputRegister = uVar19;
            pgVar5[uVar12].NumComponents = uVar7;
            pgVar5[uVar12].StreamId = uVar2;
            pgVar5[uVar12].OutputBuffer = buffer;
            pgVar5[uVar12].DstOffset = uVar20;
            uVar12 = uVar12 + 1;
            info->NumOutputs = uVar12;
          }
          info->Buffers[buffer].Stream = uVar2;
          uVar20 = uVar20 + uVar7;
          uVar19 = uVar19 + 1;
          uVar13 = 0;
          uVar9 = uVar9 - uVar7;
        } while (uVar9 != 0);
      }
      if ((explicit_stride == (bool *)0x0) || (explicit_stride[buffer] != true)) {
        info->Buffers[buffer].Stride = uVar20;
      }
      else {
        bVar8 = is_64bit(this);
        uVar9 = info->Buffers[buffer].Stride;
        if (((byte)uVar9 & bVar8) == 1) {
          linker_error(prog,
                       "invalid qualifier xfb_stride=%d must be a multiple of 8 as its applied to a type that is or contains a double."
                       ,(ulong)(uVar9 << 2));
          return false;
        }
        if (uVar9 < uVar20) {
          linker_error(prog,"xfb_offset (%d) overflows xfb_stride (%d) for buffer (%d)",
                       (ulong)(uVar20 << 2),(ulong)(uVar9 << 2),(ulong)buffer);
          return false;
        }
      }
    }
  }
  else {
    puVar1 = &info->Buffers[buffer].Stride;
    *puVar1 = *puVar1 + uVar14;
  }
  pcVar11 = ralloc_strdup(prog,this->orig_name);
  pgVar6 = info->Varyings;
  iVar3 = info->NumVarying;
  pgVar6[iVar3].Name = pcVar11;
  pgVar6[iVar3].Type = (GLenum16)this->type;
  pgVar6[iVar3].Size = uVar14;
  pgVar6[iVar3].BufferIndex = buffer_index;
  info->NumVarying = iVar3 + 1;
  puVar1 = &info->Buffers[buffer].NumVaryings;
  *puVar1 = *puVar1 + 1;
  return true;
}

Assistant:

bool
tfeedback_decl::store(struct gl_context *ctx, struct gl_shader_program *prog,
                      struct gl_transform_feedback_info *info,
                      unsigned buffer, unsigned buffer_index,
                      const unsigned max_outputs,
                      BITSET_WORD *used_components[MAX_FEEDBACK_BUFFERS],
                      bool *explicit_stride, bool has_xfb_qualifiers,
                      const void* mem_ctx) const
{
   unsigned xfb_offset = 0;
   unsigned size = this->size;
   /* Handle gl_SkipComponents. */
   if (this->skip_components) {
      info->Buffers[buffer].Stride += this->skip_components;
      size = this->skip_components;
      goto store_varying;
   }

   if (this->next_buffer_separator) {
      size = 0;
      goto store_varying;
   }

   if (has_xfb_qualifiers) {
      xfb_offset = this->offset / 4;
   } else {
      xfb_offset = info->Buffers[buffer].Stride;
   }
   info->Varyings[info->NumVarying].Offset = xfb_offset * 4;

   {
      unsigned location = this->location;
      unsigned location_frac = this->location_frac;
      unsigned num_components = this->num_components();

      /* From GL_EXT_transform_feedback:
       *
       *   " A program will fail to link if:
       *
       *       * the total number of components to capture is greater than the
       *         constant MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS_EXT
       *         and the buffer mode is INTERLEAVED_ATTRIBS_EXT."
       *
       * From GL_ARB_enhanced_layouts:
       *
       *   " The resulting stride (implicit or explicit) must be less than or
       *     equal to the implementation-dependent constant
       *     gl_MaxTransformFeedbackInterleavedComponents."
       */
      if ((prog->TransformFeedback.BufferMode == GL_INTERLEAVED_ATTRIBS ||
           has_xfb_qualifiers) &&
          xfb_offset + num_components >
          ctx->Const.MaxTransformFeedbackInterleavedComponents) {
         linker_error(prog,
                      "The MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS "
                      "limit has been exceeded.");
         return false;
      }

      /* From the OpenGL 4.60.5 spec, section 4.4.2. Output Layout Qualifiers,
       * Page 76, (Transform Feedback Layout Qualifiers):
       *
       *   " No aliasing in output buffers is allowed: It is a compile-time or
       *     link-time error to specify variables with overlapping transform
       *     feedback offsets."
       */
      const unsigned max_components =
         ctx->Const.MaxTransformFeedbackInterleavedComponents;
      const unsigned first_component = xfb_offset;
      const unsigned last_component = xfb_offset + num_components - 1;
      const unsigned start_word = BITSET_BITWORD(first_component);
      const unsigned end_word = BITSET_BITWORD(last_component);
      BITSET_WORD *used;
      assert(last_component < max_components);

      if (!used_components[buffer]) {
         used_components[buffer] =
            rzalloc_array(mem_ctx, BITSET_WORD, BITSET_WORDS(max_components));
      }
      used = used_components[buffer];

      for (unsigned word = start_word; word <= end_word; word++) {
         unsigned start_range = 0;
         unsigned end_range = BITSET_WORDBITS - 1;

         if (word == start_word)
            start_range = first_component % BITSET_WORDBITS;

         if (word == end_word)
            end_range = last_component % BITSET_WORDBITS;

         if (used[word] & BITSET_RANGE(start_range, end_range)) {
            linker_error(prog,
                         "variable '%s', xfb_offset (%d) is causing aliasing.",
                         this->orig_name, xfb_offset * 4);
            return false;
         }
         used[word] |= BITSET_RANGE(start_range, end_range);
      }

      while (num_components > 0) {
         unsigned output_size = MIN2(num_components, 4 - location_frac);
         assert((info->NumOutputs == 0 && max_outputs == 0) ||
                info->NumOutputs < max_outputs);

         /* From the ARB_enhanced_layouts spec:
          *
          *    "If such a block member or variable is not written during a shader
          *    invocation, the buffer contents at the assigned offset will be
          *    undefined.  Even if there are no static writes to a variable or
          *    member that is assigned a transform feedback offset, the space is
          *    still allocated in the buffer and still affects the stride."
          */
         if (this->is_varying_written()) {
            info->Outputs[info->NumOutputs].ComponentOffset = location_frac;
            info->Outputs[info->NumOutputs].OutputRegister = location;
            info->Outputs[info->NumOutputs].NumComponents = output_size;
            info->Outputs[info->NumOutputs].StreamId = stream_id;
            info->Outputs[info->NumOutputs].OutputBuffer = buffer;
            info->Outputs[info->NumOutputs].DstOffset = xfb_offset;
            ++info->NumOutputs;
         }
         info->Buffers[buffer].Stream = this->stream_id;
         xfb_offset += output_size;

         num_components -= output_size;
         location++;
         location_frac = 0;
      }
   }

   if (explicit_stride && explicit_stride[buffer]) {
      if (this->is_64bit() && info->Buffers[buffer].Stride % 2) {
         linker_error(prog, "invalid qualifier xfb_stride=%d must be a "
                      "multiple of 8 as its applied to a type that is or "
                      "contains a double.",
                      info->Buffers[buffer].Stride * 4);
         return false;
      }

      if (xfb_offset > info->Buffers[buffer].Stride) {
         linker_error(prog, "xfb_offset (%d) overflows xfb_stride (%d) for "
                      "buffer (%d)", xfb_offset * 4,
                      info->Buffers[buffer].Stride * 4, buffer);
         return false;
      }
   } else {
      info->Buffers[buffer].Stride = xfb_offset;
   }

 store_varying:
   info->Varyings[info->NumVarying].Name = ralloc_strdup(prog,
                                                         this->orig_name);
   info->Varyings[info->NumVarying].Type = this->type;
   info->Varyings[info->NumVarying].Size = size;
   info->Varyings[info->NumVarying].BufferIndex = buffer_index;
   info->NumVarying++;
   info->Buffers[buffer].NumVaryings++;

   return true;
}